

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::LPFwriteBounds<double>(SPxLPBase<double> *p_lp,ostream *p_output,NameSet *p_cnames)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  ostream *poVar5;
  char *pcVar6;
  ostream *in_RSI;
  double upper;
  double lower;
  int j;
  char name [16];
  int in_stack_ffffffffffffff6c;
  SPxLPBase<double> *in_stack_ffffffffffffff70;
  NameSet *in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  SPxLPBase<double> *in_stack_ffffffffffffff88;
  int local_2c;
  
  std::operator<<(in_RSI,"Bounds\n");
  for (local_2c = 0; iVar3 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x13ddf0),
      local_2c < iVar3; local_2c = local_2c + 1) {
    pdVar4 = SPxLPBase<double>::lower(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    dVar1 = *pdVar4;
    pdVar4 = SPxLPBase<double>::upper(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    dVar2 = *pdVar4;
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      pdVar4 = (double *)infinity();
      if (dVar1 <= -*pdVar4) {
        in_stack_ffffffffffffff80 = dVar2;
        pdVar4 = (double *)infinity();
        if (*pdVar4 <= in_stack_ffffffffffffff80) {
          in_stack_ffffffffffffff70 = (SPxLPBase<double> *)std::operator<<(in_RSI,"  ");
          pcVar6 = getColName<double>(in_stack_ffffffffffffff88,
                                      (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                      in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
          poVar5 = std::operator<<((ostream *)in_stack_ffffffffffffff70,pcVar6);
          std::operator<<(poVar5," free\n");
        }
        else {
          in_stack_ffffffffffffff78 = (NameSet *)std::operator<<(in_RSI,"   -Inf <= ");
          pcVar6 = getColName<double>(in_stack_ffffffffffffff88,
                                      (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                      in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
          poVar5 = std::operator<<((ostream *)in_stack_ffffffffffffff78,pcVar6);
          poVar5 = std::operator<<(poVar5," <= ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar2);
          std::operator<<(poVar5,'\n');
        }
      }
      else {
        pdVar4 = (double *)infinity();
        if (*pdVar4 <= dVar2) {
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            poVar5 = std::operator<<(in_RSI,"  ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar1);
            in_stack_ffffffffffffff88 = (SPxLPBase<double> *)std::operator<<(poVar5," <= ");
            pcVar6 = getColName<double>(in_stack_ffffffffffffff88,
                                        (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                        in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70)
            ;
            poVar5 = std::operator<<((ostream *)in_stack_ffffffffffffff88,pcVar6);
            std::operator<<(poVar5,'\n');
          }
        }
        else if ((dVar1 != 0.0) || (NAN(dVar1))) {
          poVar5 = std::operator<<(in_RSI,"  ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar1);
          poVar5 = std::operator<<(poVar5," <= ");
          pcVar6 = getColName<double>(in_stack_ffffffffffffff88,
                                      (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                      in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
          poVar5 = std::operator<<(poVar5,pcVar6);
          poVar5 = std::operator<<(poVar5," <= ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar2);
          std::operator<<(poVar5,'\n');
        }
        else {
          poVar5 = std::operator<<(in_RSI,"  ");
          pcVar6 = getColName<double>(in_stack_ffffffffffffff88,
                                      (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                      in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
          poVar5 = std::operator<<(poVar5,pcVar6);
          poVar5 = std::operator<<(poVar5," <= ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar2);
          std::operator<<(poVar5,'\n');
        }
      }
    }
    else {
      poVar5 = std::operator<<(in_RSI,"  ");
      pcVar6 = getColName<double>(in_stack_ffffffffffffff88,
                                  (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                  in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar2);
      std::operator<<(poVar5,'\n');
    }
  }
  return;
}

Assistant:

static void LPFwriteBounds(
   const SPxLPBase<R>&   p_lp,       ///< the LP to write
   std::ostream&            p_output,   ///< output stream
   const NameSet*           p_cnames    ///< column names
)
{

   char name[16];

   p_output << "Bounds\n";

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R lower = p_lp.lower(j);
      const R upper = p_lp.upper(j);

      if(lower == upper)
      {
         p_output << "  "   << getColName(p_lp, j, p_cnames, name) << " = "  << upper << '\n';
      }
      else if(lower > R(-infinity))
      {
         if(upper < R(infinity))
         {
            // range bound
            if(lower != 0)
               p_output << "  "   << lower << " <= "
                        << getColName(p_lp, j, p_cnames, name)
                        << " <= " << upper << '\n';
            else
               p_output << "  "   << getColName(p_lp, j, p_cnames, name)
                        << " <= " << upper << '\n';
         }
         else if(lower != 0)
            p_output << "  " << lower << " <= "
                     << getColName(p_lp, j, p_cnames, name)
                     << '\n';
      }
      else if(upper < R(infinity))
         p_output << "   -Inf <= "
                  << getColName(p_lp, j, p_cnames, name)
                  << " <= " << upper << '\n';
      else
         p_output << "  "   << getColName(p_lp, j, p_cnames, name)
                  << " free\n";
   }
}